

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall arma::Mat<double>::Mat(Mat<double> *this,uword in_n_rows,uword in_n_cols)

{
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  uword in_stack_ffffffffffffffdc;
  
  *(int *)in_RDI = in_ESI;
  *(int *)((long)in_RDI + 4) = in_EDX;
  *(int *)(in_RDI + 1) = in_ESI * in_EDX;
  *(int *)((long)in_RDI + 0xc) = 0;
  *(undefined2 *)(in_RDI + 2) = 0;
  *(undefined2 *)((long)in_RDI + 0x12) = 0;
  in_RDI[4] = 0.0;
  init_cold((Mat<double> *)CONCAT44(in_n_rows,in_n_cols));
  arrayops::fill_zeros<double>(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const uword in_n_rows, const uword in_n_cols)
  : n_rows(in_n_rows)
  , n_cols(in_n_cols)
  , n_elem(in_n_rows*in_n_cols)
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  
  arma_debug_print("Mat::constructor: zeroing memory");
  
  arrayops::fill_zeros(memptr(), n_elem);
  }